

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_ice_blast(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  OBJ_DATA *pOVar2;
  int iVar3;
  OBJ_DATA *obj;
  OBJ_AFFECT_DATA oaf;
  
  act("You extend an arm toward $N and send forth a frigid blast!",ch,(void *)0x0,vo,3);
  act("$n extends an arm toward you and sends forth a frigid blast!",ch,(void *)0x0,vo,2);
  act("$n extends an arm toward $N and sends forth a frigid blast!",ch,(void *)0x0,vo,1);
  iVar3 = dice(level,3);
  damage_new(ch,(CHAR_DATA *)vo,iVar3,(int)gsn_ice_blast,5,true,false,0,1,(char *)0x0);
  if (*(OBJ_DATA **)((long)vo + 0x98) != (OBJ_DATA *)0x0) {
    obj = *(OBJ_DATA **)((long)vo + 0x98);
    do {
      pOVar2 = obj->next_content;
      sVar1 = obj->item_type;
      if (sVar1 == 10) {
        iVar3 = number_percent();
        if (iVar3 < 0x2e) {
LAB_00319641:
          act("$p freezes and shatters!",(CHAR_DATA *)vo,obj,(void *)0x0,4);
          extract_obj(obj);
        }
      }
      else if (sVar1 == 0xf) {
        iVar3 = number_percent();
        if (iVar3 < 0x10) {
          act("$p is frozen shut by a thick layer of ice!",(CHAR_DATA *)vo,obj,(void *)0x0,4);
          init_affect_obj(&oaf);
          oaf.where = 0;
          oaf.aftype = 0;
          oaf.type = gsn_ice_blast;
          oaf.level = (short)level;
          oaf.location = 0;
          oaf.modifier = 0;
          oaf.end_fun = container_defrost;
          oaf.tick_fun = (OAFF_FUN *)0x0;
          oaf.owner = ch;
          oaf.duration = (short)(level / 6);
          affect_to_obj(obj,&oaf);
        }
      }
      else if ((sVar1 == 0x11) && (iVar3 = number_percent(), iVar3 < 0x4c)) goto LAB_00319641;
      obj = pOVar2;
    } while (pOVar2 != (OBJ_DATA *)0x0);
  }
  return;
}

Assistant:

void spell_ice_blast(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj, *obj_next;
	OBJ_AFFECT_DATA oaf;

	act("You extend an arm toward $N and send forth a frigid blast!", ch, 0, victim, TO_CHAR);
	act("$n extends an arm toward you and sends forth a frigid blast!", ch, 0, victim, TO_VICT);
	act("$n extends an arm toward $N and sends forth a frigid blast!", ch, 0, victim, TO_NOTVICT);

	damage_new(ch, victim, dice(level, 3), gsn_ice_blast, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

	for (obj = victim->carrying; obj; obj = obj_next)
	{
		obj_next = obj->next_content;

		switch (obj->item_type)
		{
			case ITEM_DRINK_CON:
				if (number_percent() <= 75)
				{
					act("$p freezes and shatters!", victim, obj, 0, TO_ALL);
					extract_obj(obj);
				}

				break;
			case ITEM_POTION:
				if (number_percent() <= 45)
				{
					act("$p freezes and shatters!", victim, obj, 0, TO_ALL);
					extract_obj(obj);
				}

				break;
			case ITEM_CONTAINER:
				if (number_percent() <= 15)
				{
					act("$p is frozen shut by a thick layer of ice!", victim, obj, 0, TO_ALL);
					init_affect_obj(&oaf);
					oaf.where = TO_OBJ_AFFECTS;
					oaf.aftype = AFT_SPELL;
					oaf.type = gsn_ice_blast;
					oaf.level = level;
					oaf.location = 0;
					oaf.modifier = 0;
					oaf.duration = level / 6;
					oaf.owner = ch;
					oaf.end_fun = container_defrost;
					oaf.tick_fun = nullptr;
					affect_to_obj(obj, &oaf);
				}

				break;
			default:
				continue;
		}
	}
}